

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryNode(aiNode *node)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  uint32_t old;
  uint32_t len;
  aiNode *node_local;
  
  ofs = WriteMagic(0x123c);
  uVar1 = Write<aiString>(&node->mName);
  uVar2 = Write<aiMatrix4x4t<float>>(&node->mTransformation);
  uVar3 = Write<unsigned_int>(&node->mNumChildren);
  uVar4 = Write<unsigned_int>(&node->mNumMeshes);
  i = uVar4 + uVar3 + uVar2 + uVar1;
  for (local_1c = 0; local_1c < node->mNumMeshes; local_1c = local_1c + 1) {
    uVar1 = Write<unsigned_int>(node->mMeshes + local_1c);
    i = uVar1 + i;
  }
  for (local_20 = 0; local_20 < node->mNumChildren; local_20 = local_20 + 1) {
    uVar1 = WriteBinaryNode(node->mChildren[local_20]);
    i = uVar1 + 8 + i;
  }
  ChangeInteger(ofs,i);
  return i;
}

Assistant:

uint32_t WriteBinaryNode(const aiNode* node)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AINODE);
	len += Write<aiString>(node->mName);
	len += Write<aiMatrix4x4>(node->mTransformation);
	len += Write<unsigned int>(node->mNumChildren);
	len += Write<unsigned int>(node->mNumMeshes);

	for (unsigned int i = 0; i < node->mNumMeshes;++i) {
		len += Write<unsigned int>(node->mMeshes[i]);
	}

	for (unsigned int i = 0; i < node->mNumChildren;++i) {
		len += WriteBinaryNode(node->mChildren[i])+8;
	}

	ChangeInteger(old,len);
	return len;
}